

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O1

void gl4cts::MultiBind::Texture::Storage
               (Functions *gl,GLenum target,GLsizei levels,GLenum internal_format,GLuint width,
               GLuint height,GLuint depth,bool allow_error)

{
  GLenum err;
  TestError *this;
  int line;
  char *msg;
  
  if ((int)target < 0x8c18) {
    if ((int)target < 0x806f) {
      if (target == 0xde0) {
        (*gl->texStorage1D)(0xde0,levels,internal_format,width);
        if (allow_error) {
          return;
        }
        err = (*gl->getError)();
        msg = "TexStorage1D";
        line = 0x4ca;
        goto LAB_008cf902;
      }
      if (target != 0xde1) goto LAB_008cf981;
    }
    else {
      if (target == 0x806f) goto LAB_008cf890;
      if ((target != 0x84f5) && (target != 0x8513)) {
LAB_008cf981:
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Invliad enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                   ,0x4ef);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
LAB_008cf8c7:
    (*gl->texStorage2D)(target,levels,internal_format,width,height);
    if (!allow_error) {
      err = (*gl->getError)();
      msg = "TexStorage2D";
      line = 0x4d4;
LAB_008cf902:
      glu::checkError(err,msg,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                      ,line);
      return;
    }
  }
  else {
    if ((int)target < 0x9009) {
      if (target == 0x8c18) goto LAB_008cf8c7;
      if (target != 0x8c1a) goto LAB_008cf981;
    }
    else if (target != 0x9009) {
      if (target == 0x9100) {
        (*gl->texStorage2DMultisample)(0x9100,levels,internal_format,width,height,'\0');
        if (allow_error) {
          return;
        }
        err = (*gl->getError)();
        msg = "TexStorage2DMultisample";
        line = 0x4db;
      }
      else {
        if (target != 0x9102) goto LAB_008cf981;
        (*gl->texStorage3DMultisample)(0x9102,levels,internal_format,width,height,depth,'\0');
        if (allow_error) {
          return;
        }
        err = (*gl->getError)();
        msg = "TexStorage3DMultisample";
        line = 0x4e2;
      }
      goto LAB_008cf902;
    }
LAB_008cf890:
    (*gl->texStorage3D)(target,levels,internal_format,width,height,depth);
    if (!allow_error) {
      err = (*gl->getError)();
      msg = "TexStorage3D";
      line = 0x4eb;
      goto LAB_008cf902;
    }
  }
  return;
}

Assistant:

void Texture::Storage(const glw::Functions& gl, glw::GLenum target, glw::GLsizei levels, glw::GLenum internal_format,
					  glw::GLuint width, glw::GLuint height, glw::GLuint depth, bool allow_error)
{
	switch (target)
	{
	case GL_TEXTURE_1D:
		gl.texStorage1D(target, levels, internal_format, width);
		if (!allow_error)
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage1D");
		}
		break;
	case GL_TEXTURE_1D_ARRAY:
	case GL_TEXTURE_2D:
	case GL_TEXTURE_RECTANGLE:
	case GL_TEXTURE_CUBE_MAP:
		gl.texStorage2D(target, levels, internal_format, width, height);
		if (!allow_error)
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage2D");
		}
		break;
	case GL_TEXTURE_2D_MULTISAMPLE:
		gl.texStorage2DMultisample(target, levels, internal_format, width, height, GL_FALSE);
		if (!allow_error)
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage2DMultisample");
		}
		break;
	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		gl.texStorage3DMultisample(target, levels, internal_format, width, height, depth, GL_FALSE);
		if (!allow_error)
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage3DMultisample");
		}
		break;
	case GL_TEXTURE_3D:
	case GL_TEXTURE_2D_ARRAY:
	case GL_TEXTURE_CUBE_MAP_ARRAY:
		gl.texStorage3D(target, levels, internal_format, width, height, depth);
		if (!allow_error)
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage3D");
		}
		break;
	default:
		TCU_FAIL("Invliad enum");
		break;
	}
}